

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

CURLcode proxy_h2_progress_egress(Curl_cfilter *cf,Curl_easy *data)

{
  undefined8 *puVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  uint local_2c;
  int rv;
  cf_h2_proxy_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puVar1 = (undefined8 *)cf->ctx;
  local_2c = 0;
  *(byte *)(puVar1 + 0x28) = *(byte *)(puVar1 + 0x28) & 0xfb;
  while( true ) {
    bVar4 = false;
    if ((local_2c == 0) && (bVar4 = false, (*(byte *)(puVar1 + 0x28) >> 2 & 1) == 0)) {
      iVar2 = nghttp2_session_want_write((nghttp2_session *)*puVar1);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    local_2c = nghttp2_session_send((nghttp2_session *)*puVar1);
  }
  iVar2 = nghttp2_is_fatal(local_2c);
  if (iVar2 == 0) {
    cf_local._4_4_ = proxy_h2_nw_out_flush(cf,data);
  }
  else {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
        (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
      pcVar3 = nghttp2_strerror(local_2c);
      Curl_trc_cf_infof(data,cf,"[0] nghttp2_session_send error (%s)%d",pcVar3,(ulong)local_2c);
    }
    cf_local._4_4_ = CURLE_SEND_ERROR;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode proxy_h2_progress_egress(struct Curl_cfilter *cf,
                                         struct Curl_easy *data)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  int rv = 0;

  ctx->nw_out_blocked = 0;
  while(!rv && !ctx->nw_out_blocked && nghttp2_session_want_write(ctx->h2))
    rv = nghttp2_session_send(ctx->h2);

  if(nghttp2_is_fatal(rv)) {
    CURL_TRC_CF(data, cf, "[0] nghttp2_session_send error (%s)%d",
                nghttp2_strerror(rv), rv);
    return CURLE_SEND_ERROR;
  }
  return proxy_h2_nw_out_flush(cf, data);
}